

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O1

void __thiscall xercesc_4_0::QName::setValues(QName *this,QName *qname)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  
  pXVar2 = qname->fPrefix;
  XVar3 = 0;
  if (pXVar2 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar2 + XVar3);
      XVar3 = XVar3 + 2;
    } while (*psVar1 != 0);
    XVar3 = ((long)XVar3 >> 1) - 1;
  }
  setNPrefix(this,pXVar2,XVar3);
  pXVar2 = qname->fLocalPart;
  XVar3 = 0;
  if (pXVar2 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar2 + XVar3);
      XVar3 = XVar3 + 2;
    } while (*psVar1 != 0);
    XVar3 = ((long)XVar3 >> 1) - 1;
  }
  setNLocalPart(this,pXVar2,XVar3);
  this->fURIId = qname->fURIId;
  return;
}

Assistant:

void QName::setValues(const QName& qname)
{
    setPrefix(qname.getPrefix());
    setLocalPart(qname.getLocalPart());
    setURI(qname.getURI());
}